

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint8_t * svb_insert_scalar_d1_init
                    (uint8_t *keyPtr,uint8_t *dataPtr,size_t dataSize,uint32_t count,uint32_t prev,
                    uint32_t new_key,uint32_t *position)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint in_ECX;
  long in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint *in_stack_00000008;
  uint8_t code;
  uint8_t code_1;
  int gap;
  uint8_t *p;
  uint32_t prev_carry_bits;
  uint32_t carry_bits;
  uint32_t mask_lo;
  uint32_t mask_hi;
  uint32_t current_key;
  uint8_t current_key_code;
  uint8_t *dataPtrPrev;
  uint32_t c;
  uint8_t *dataPtrBegin;
  uint32_t key;
  uint8_t shift;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined4 in_stack_ffffffffffffff8c;
  uint8_t *in_stack_ffffffffffffff90;
  byte *pbVar10;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_44;
  uint local_34;
  byte local_2d;
  uint local_28;
  byte *local_18;
  byte *local_10;
  byte *local_8;
  
  if (in_ECX == 0) {
    *in_stack_00000008 = 0;
    local_8 = svb_encode_scalar_d1_init
                        ((uint32_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff90,
                         (uint8_t *)
                         CONCAT44(in_stack_ffffffffffffff8c,
                                  CONCAT13(in_stack_ffffffffffffff8b,
                                           CONCAT12(in_stack_ffffffffffffff8a,
                                                    in_stack_ffffffffffffff88))),
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
  }
  else {
    local_2d = 0;
    local_34 = (uint)*in_RDI;
    local_28 = in_R8D;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_44 = 0; pbVar1 = local_18, local_44 < in_ECX; local_44 = local_44 + 1) {
      if (local_2d == 8) {
        local_2d = 0;
        local_34 = (uint)local_10[1];
        local_10 = local_10 + 1;
      }
      bVar2 = (byte)(local_34 >> (local_2d & 0x1f)) & 3;
      uVar6 = local_28;
      uVar5 = _decode_data(&local_18,bVar2);
      uVar6 = uVar6 + uVar5;
      if (in_R9D <= uVar6) {
        uVar7 = (local_34 & -1 << (local_2d & 0x1f)) << 2;
        uVar8 = uVar7 >> 8;
        pbVar10 = local_10;
        while (pbVar10 = pbVar10 + 1, pbVar10 < in_RSI) {
          bVar3 = *pbVar10;
          *pbVar10 = *pbVar10 << 2;
          *pbVar10 = *pbVar10 | (byte)uVar8;
          uVar8 = (int)(bVar3 & 0xc0) >> 6;
        }
        local_18 = pbVar1;
        bVar3 = _encoded_length(in_R9D - local_28);
        uVar8 = (uint)bVar3;
        bVar3 = _encoded_length(uVar6 - in_R9D);
        iVar9 = (uVar8 + bVar3) - (bVar2 + 1);
        if (0 < iVar9) {
          memmove(local_18 + iVar9,local_18,in_RDX - ((long)local_18 - (long)in_RSI));
        }
        uVar4 = _encode_data(in_R9D - local_28,&local_18);
        *local_10 = (byte)uVar7 | (byte)local_34 & (char)(1 << (local_2d & 0x1f)) - 1U |
                    uVar4 << (local_2d & 0x1f);
        local_2d = local_2d + 2;
        if (local_2d == 8) {
          local_2d = 0;
          local_10 = local_10 + 1;
        }
        uVar4 = _encode_data(uVar6 - in_R9D,&local_18);
        *local_10 = *local_10 & ((byte)(3 << (local_2d & 0x1f)) ^ 0xff);
        *local_10 = *local_10 | uVar4 << (local_2d & 0x1f);
        *in_stack_00000008 = local_44;
        return in_RSI + iVar9 + in_RDX;
      }
      local_2d = local_2d + 2;
      local_28 = uVar6;
    }
    if (local_2d == 8) {
      local_2d = 0;
      local_10 = local_10 + 1;
    }
    bVar2 = _encode_data(in_R9D - local_28,&local_18);
    *local_10 = bVar2 << (local_2d & 0x1f) |
                ((byte)(3 << (local_2d & 0x1f)) ^ 0xff) & (byte)local_34;
    *in_stack_00000008 = in_ECX;
    local_8 = in_RSI + (int)(uint)bVar2 + in_RDX + 1;
  }
  return local_8;
}

Assistant:

uint8_t *svb_insert_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   size_t dataSize, uint32_t count,
                                   uint32_t prev, uint32_t new_key,
                                   uint32_t *position) {
  if (count == 0) {
    *position = 0;
    return svb_encode_scalar_d1_init(&new_key, keyPtr, dataPtr, 1, prev);
  }

  uint8_t shift = 0;
  uint32_t key = *keyPtr;
  uint8_t *dataPtrBegin = dataPtr;

  for (uint32_t c = 0; c < count; c++) {
    uint8_t *dataPtrPrev = dataPtr;

    if (shift == 8) {
      shift = 0;
      key = *(++keyPtr);
    }

    uint8_t current_key_code = (key >> shift) & 0x3;
    uint32_t current_key = prev + _decode_data(&dataPtr, current_key_code);
    if (current_key >= new_key) {
      // rewind to the insertion position
      dataPtr = dataPtrPrev;

      // shift keys 2 bits "to the right"
      uint32_t mask_hi = key & (~0u << shift);
      uint32_t mask_lo = key & ((1 << shift) - 1);
      key = (mask_hi << 2) | mask_lo;
      uint32_t carry_bits, prev_carry_bits = (key & (3 << 8)) >> 8;

      for (uint8_t *p = keyPtr + 1; p < dataPtrBegin; p++) {
        carry_bits = (*p & (3 << 6)) >> 6;
        *p <<= 2;
        *p |= prev_carry_bits;
        prev_carry_bits = carry_bits;
      }

      // shift values n bytes "to the right", then insert the new key
      // and the updated delta of the next key
      int gap = _encoded_length(new_key - prev) +
                _encoded_length(current_key - new_key) - (current_key_code + 1);
      assert(gap >= 0);
      if (gap > 0)
        memmove(dataPtr + gap, dataPtr, dataSize - (dataPtr - dataPtrBegin));

      // first insert the new key
      uint8_t code = _encode_data(new_key - prev, &dataPtr);
      *keyPtr = (uint8_t)(key | (code << shift));

      // then update the current key
      shift += 2;
      if (shift == 8) {
        shift = 0;
        keyPtr++;
      }
      code = _encode_data(current_key - new_key, &dataPtr);
      *keyPtr &= ~(3 << shift);
      *keyPtr |= (code << shift);

      *position = c;
      return dataPtrBegin + dataSize + gap;
    }

    prev = current_key;
    shift += 2;
  }

  // append the new key at the end
  if (shift == 8) {
    shift = 0;
    keyPtr++;
  }

  uint8_t code = _encode_data(new_key - prev, &dataPtr);
  key &= ~(3 << shift);
  key |= code << shift;
  *keyPtr = (uint8_t)(key); // write last key (no increment needed)

  *position = count;
  return dataPtrBegin + dataSize + code + 1;
}